

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::TestTextureCube::TestTextureCube
          (TestTextureCube *this,CompressedTexFormat *format,int size)

{
  pointer pPVar1;
  ChannelOrder *pCVar2;
  int *piVar3;
  undefined8 *puVar4;
  CubeFace face;
  pointer pPVar5;
  ChannelOrder CVar6;
  ChannelOrder CVar7;
  ChannelOrder CVar8;
  ChannelOrder CVar9;
  undefined8 uVar10;
  TestTextureCube *this_00;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int levelNdx;
  long lVar15;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> levels;
  allocator_type local_69;
  TestTextureCube *local_68;
  TextureCube *local_60;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> local_58;
  CompressedTexFormat *local_40;
  long local_38;
  
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTextureCube_00d28488;
  local_58.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)tcu::getUncompressedFormat(*format);
  local_60 = &this->m_texture;
  tcu::TextureCube::TextureCube(local_60,(TextureFormat *)&local_58,size);
  local_40 = format;
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            (&local_58,
             (long)(((ulong)(uint)((int)((ulong)((long)(this->m_texture).m_access[0].
                                                                                                              
                                                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->m_texture).m_access[0].
                                                                                                            
                                                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                  -0x33333333) << 0x21) * 3) >> 0x20,&local_69);
  lVar14 = 0;
  lVar15 = 0;
  local_68 = this;
  while( true ) {
    this_00 = local_68;
    iVar11 = (*(local_68->super_TestTexture)._vptr_TestTexture[2])(local_68);
    if (iVar11 <= lVar15) break;
    lVar13 = 0;
    local_38 = lVar14;
    do {
      face = *(CubeFace *)((long)&tcuFaceMapping + lVar13);
      tcu::TextureCube::allocLevel(local_60,face,(int)lVar15);
      pPVar5 = (this->m_texture).m_access[face].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar14 >> 0x20;
      *(void **)((long)local_58.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x20 + lVar12 * 0x28) =
           pPVar5[lVar15].super_ConstPixelBufferAccess.m_data;
      pPVar1 = pPVar5 + lVar15;
      CVar6 = (pPVar1->super_ConstPixelBufferAccess).m_format.order;
      CVar7 = (pPVar1->super_ConstPixelBufferAccess).m_format.type;
      CVar8 = (pPVar1->super_ConstPixelBufferAccess).m_size.m_data[0];
      CVar9 = (pPVar1->super_ConstPixelBufferAccess).m_size.m_data[1];
      piVar3 = pPVar5[lVar15].super_ConstPixelBufferAccess.m_size.m_data + 2;
      uVar10 = *(undefined8 *)(piVar3 + 2);
      puVar4 = (undefined8 *)
               ((long)local_58.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0x10 + lVar12 * 0x28);
      *puVar4 = *(undefined8 *)piVar3;
      puVar4[1] = uVar10;
      pCVar2 = (ChannelOrder *)
               ((long)local_58.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar12 * 0x28);
      *pCVar2 = CVar6;
      pCVar2[1] = CVar7;
      pCVar2[2] = CVar8;
      pCVar2[3] = CVar9;
      lVar14 = lVar14 + 0x100000000;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x18);
    lVar15 = lVar15 + 1;
    lVar14 = local_38 + 0x600000000;
  }
  TestTexture::populateCompressedLevels(&this_00->super_TestTexture,*local_40,&local_58);
  if ((TextureFormat)
      local_58.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (TextureFormat)0x0) {
    operator_delete(local_58.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TestTextureCube::TestTextureCube (const tcu::CompressedTexFormat& format, int size)
	: TestTexture	(format, size, size, 1)
	, m_texture		(tcu::getUncompressedFormat(format), size)
{
	std::vector<tcu::PixelBufferAccess> levels(m_texture.getNumLevels() * tcu::CUBEFACE_LAST);

	for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
	{
		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			m_texture.allocLevel(tcuFaceMapping[faceNdx], levelNdx);
			levels[levelNdx * tcu::CUBEFACE_LAST + faceNdx] = m_texture.getLevelFace(levelNdx, tcuFaceMapping[faceNdx]);
		}
	}

	TestTexture::populateCompressedLevels(format, levels);
}